

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,duration<long,_std::ratio<1L,_1000L>_> *param,
          TimedCaller *param_2)

{
  TimedCaller local_50;
  
  std::mutex::lock(&this->guard_);
  TimedCaller::TimedCaller(&local_50,param_2);
  TimedExecution::push<long,std::ratio<1l,1000l>,TimedCaller>(&this->queue_,param,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }